

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O2

void __thiscall
test::iu_AssertionTest_x_iutest_x_Pred4_Test::Body(iu_AssertionTest_x_iutest_x_Pred4_Test *this)

{
  AssertionResult iutest_ar;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  Fixed local_198;
  
  iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x287e81,
             (_func_bool_int_int_int_int *)CONCAT71(iutest_ar._33_7_,iutest_ar.m_result),
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe50);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&stack0xfffffffffffffe38,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
               ,0x2f,iutest_ar.m_message._M_dataplus._M_p);
    iutest::AssertionHelper::operator=((AssertionHelper *)&stack0xfffffffffffffe38,&local_198);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x287ed7,
               (_func_bool_int_int_int_int *)CONCAT71(iutest_ar._33_7_,iutest_ar.m_result),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe38,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x30,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=((AssertionHelper *)&stack0xfffffffffffffe38,&local_198);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x287f88,
               (_func_bool_int_int_int_int *)CONCAT71(iutest_ar._33_7_,iutest_ar.m_result),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe38,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x31,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=((AssertionHelper *)&stack0xfffffffffffffe38,&local_198);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x288036,
               (_func_bool_int_int_int_int *)CONCAT71(iutest_ar._33_7_,iutest_ar.m_result),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&stack0xfffffffffffffe38,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x32,iutest_ar.m_message._M_dataplus._M_p);
      iutest::AssertionHelper::operator=((AssertionHelper *)&stack0xfffffffffffffe38,&local_198);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(AssertionTest, Pred4)
{
    IUTEST_ASSERT_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_EXPECT_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_INFORM_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_ASSUME_PRED4(PredTest4, 0, 1, 2, 3);
}